

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QShaderDescription::InOutVariable>::resize_internal
          (QList<QShaderDescription::InOutVariable> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QShaderDescription::InOutVariable> *this_00;
  __off_t __length;
  QArrayDataPointer<QShaderDescription::InOutVariable> *in_RSI;
  QArrayDataPointer<QShaderDescription::InOutVariable> *in_RDI;
  QArrayDataPointer<QShaderDescription::InOutVariable> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QShaderDescription::InOutVariable> *this_01;
  QArrayDataPointer<QShaderDescription::InOutVariable> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QShaderDescription::InOutVariable> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QShaderDescription::InOutVariable> *__file;
  
  QArrayDataPointer<QShaderDescription::InOutVariable>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QShaderDescription::InOutVariable>::needsDetach
                    (in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QShaderDescription::InOutVariable> *)
         capacity((QList<QShaderDescription::InOutVariable> *)0x6ed551);
    qVar2 = QArrayDataPointer<QShaderDescription::InOutVariable>::freeSpaceAtBegin
                      (in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QShaderDescription::InOutVariable> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QGenericArrayOps<QShaderDescription::InOutVariable> *)
                QArrayDataPointer<QShaderDescription::InOutVariable>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QShaderDescription::InOutVariable>::truncate
                (this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QShaderDescription::InOutVariable>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (InOutVariable **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}